

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O2

ParameterError file2string(char **bufp,FILE *file)

{
  char *pcVar1;
  size_t sVar2;
  char *__ptr;
  long lVar3;
  char buffer [256];
  
  if (file == (FILE *)0x0) {
    __ptr = (char *)0x0;
  }
  else {
    __ptr = (char *)0x0;
    lVar3 = 0;
    while (pcVar1 = fgets(buffer,0x100,(FILE *)file), pcVar1 != (char *)0x0) {
      pcVar1 = strchr(buffer,0xd);
      if (pcVar1 != (char *)0x0) {
        *pcVar1 = '\0';
      }
      pcVar1 = strchr(buffer,10);
      if (pcVar1 != (char *)0x0) {
        *pcVar1 = '\0';
      }
      sVar2 = strlen(buffer);
      pcVar1 = (char *)realloc(__ptr,sVar2 + lVar3 + 1);
      if (pcVar1 == (char *)0x0) {
        free(__ptr);
        return PARAM_NO_MEM;
      }
      strcpy(pcVar1 + lVar3,buffer);
      __ptr = pcVar1;
      lVar3 = sVar2 + lVar3;
    }
  }
  *bufp = __ptr;
  return PARAM_OK;
}

Assistant:

ParameterError file2string(char **bufp, FILE *file)
{
  char buffer[256];
  char *ptr;
  char *string = NULL;
  size_t stringlen = 0;
  size_t buflen;

  if(file) {
    while(fgets(buffer, sizeof(buffer), file)) {
      if((ptr = strchr(buffer, '\r')) != NULL)
        *ptr = '\0';
      if((ptr = strchr(buffer, '\n')) != NULL)
        *ptr = '\0';
      buflen = strlen(buffer);
      if((ptr = realloc(string, stringlen+buflen+1)) == NULL) {
        Curl_safefree(string);
        return PARAM_NO_MEM;
      }
      string = ptr;
      strcpy(string+stringlen, buffer);
      stringlen += buflen;
    }
  }
  *bufp = string;
  return PARAM_OK;
}